

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

DateData * asl::Date::calc(DateData *__return_storage_ptr__,double t)

{
  ulong uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  
  if (NAN(t)) {
    __return_storage_ptr__->hours = 0;
    __return_storage_ptr__->minutes = 0;
    __return_storage_ptr__->seconds = 0;
    __return_storage_ptr__->weekDay = 0;
    __return_storage_ptr__->year = 0;
    __return_storage_ptr__->month = 0;
    __return_storage_ptr__->day = 0;
    __return_storage_ptr__->hours = 0;
  }
  else {
    uVar6 = yearFromTime(t);
    __return_storage_ptr__->year = uVar6;
    if ((uVar6 & 3) == 0) {
      uVar7 = uVar6 * -0x3d70a3d7 + 0x51eb850;
      uVar13 = 1;
      if ((uVar7 >> 2 | uVar6 * 0x40000000) < 0x28f5c29) {
        uVar13 = (ulong)((uVar7 >> 4 | uVar6 * -0x70000000) < 0xa3d70b);
      }
    }
    else {
      uVar13 = 0;
    }
    dVar3 = floor(t / 86400.0);
    dVar4 = floor((double)(int)(uVar6 - 0x7b1) * 0.25);
    dVar14 = floor((double)(int)(uVar6 - 0x76d) / 100.0);
    dVar5 = floor((double)(int)(uVar6 - 0x641) / 400.0);
    iVar8 = (int)(dVar3 - (dVar5 + ((dVar4 + (double)(int)(uVar6 * 0x16d + -0xaf8ca)) - dVar14)));
    iVar9 = iVar8 + 0x1f;
    if (-1 < iVar8) {
      iVar9 = iVar8;
    }
    uVar6 = iVar9 >> 5;
    uVar12 = 0xd;
    if (0xd < (int)uVar6) {
      uVar12 = (ulong)uVar6;
    }
    __return_storage_ptr__->month = 1;
    uVar11 = (long)(int)uVar6;
    do {
      if (uVar12 == uVar11) goto LAB_0013924c;
      uVar1 = uVar11 + 1;
      lVar2 = uVar11 * 4;
      uVar11 = uVar1;
    } while (*(int *)(uVar13 * 0x38 + 0x142ea4 + lVar2) <= iVar8);
    __return_storage_ptr__->month = (int)uVar1 + -1;
LAB_0013924c:
    __return_storage_ptr__->day =
         (iVar8 - *(int *)(month_days + (long)__return_storage_ptr__->month * 4 + uVar13 * 0x38)) +
         1;
    dVar3 = (t + 0.0005) / 86400.0;
    dVar4 = floor(dVar3);
    dVar14 = (dVar3 - dVar4) * 24.0;
    dVar3 = floor(dVar14);
    dVar14 = (dVar14 - (double)(int)dVar3) * 60.0;
    dVar5 = floor(dVar14);
    dVar14 = floor((dVar14 - (double)(int)dVar5) * 60.0);
    __return_storage_ptr__->hours = (int)dVar3;
    __return_storage_ptr__->minutes = (int)dVar5;
    iVar8 = (int)dVar4;
    __return_storage_ptr__->seconds = (int)dVar14;
    iVar9 = (int)((ulong)((long)(iVar8 + -3) * -0x6db6db6d) >> 0x20) + iVar8 + -3;
    iVar9 = ((iVar9 >> 2) - (iVar9 >> 0x1f)) * -7;
    iVar10 = iVar8 + iVar9 + -3;
    iVar9 = iVar8 + 4 + iVar9;
    if (-1 < iVar10) {
      iVar9 = iVar10;
    }
    __return_storage_ptr__->weekDay = iVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

DateData Date::calc(double t)
{
	DateData date;
	if (t != t)
	{
		memset(&date, 0, sizeof(date));
		return date;
	}
	date.year = yearFromTime(t);
	int leap = isLeapYear(t) ? 1 : 0;
	int yd = (int)dayWithinYear(t, date.year);
	date.month = 1;

	for (int i = yd / 32; i < 13; i++)
	{
		if (yd < month_days[leap][i + 1])
		{
			date.month = i;
			break;
		}
	}
	date.day = yd - month_days[leap][date.month] + 1;

	t += 0.0005;
	double dt = ((t / 86400.0) - floor(t / 86400.0));
	int    h = (int)floor(24 * dt);
	int    m = (int)floor((24 * dt - h) * 60);
	int    s = (int)floor(((24 * dt - h) * 60 - m) * 60.0);
	
	date.hours = h;
	date.minutes = m;
	date.seconds = s;
	date.weekDay = ((int)floor(t / 86400.0) - 3) % 7;
	if (date.weekDay < 0)
		date.weekDay += 7;
	return date;
}